

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int lj_cf_os_exit(lua_State *L)

{
  uint local_14;
  int status;
  lua_State *L_local;
  
  if ((L->base < L->top) &&
     (((int)(L->base->field_4).it >> 0xf == -2 || ((int)(L->base->field_4).it >> 0xf == -3)))) {
    local_14 = (uint)((int)(L->base->field_4).it >> 0xf == -2);
  }
  else {
    local_14 = lj_lib_optint(L,1,0);
  }
  if ((L->base + 1 < L->top) && ((uint)((int)L->base[1].field_4.it >> 0xf) < 0xfffffffe)) {
    lua_close(L);
  }
  exit(local_14);
}

Assistant:

LJLIB_CF(os_exit)
{
  int status;
  if (L->base < L->top && tvisbool(L->base))
    status = boolV(L->base) ? EXIT_SUCCESS : EXIT_FAILURE;
  else
    status = lj_lib_optint(L, 1, EXIT_SUCCESS);
  if (L->base+1 < L->top && tvistruecond(L->base+1))
    lua_close(L);
  exit(status);
  return 0;  /* Unreachable. */
}